

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O0

void byte_swapped_displayregion(int x,int y,int w,int h)

{
  uint *longptr;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  bit_reverse_region((unsigned_short *)
                     ((long)DisplayRegion68k +
                      (long)(x + 7 >> 3) + (ulong)((displaywidth >> 4) * y) * 2 & 0xfffffffc),w,h,
                     displaywidth >> 4);
  return;
}

Assistant:

void byte_swapped_displayregion(int x, int y, int w, int h)
{
  unsigned int *longptr;

  /* Get QUAD byte aligned pointer */
  longptr = (unsigned int *)(((UNSIGNED)((DLword *)DisplayRegion68k + (DLWORD_PERLINE * y)) +
                              ((x + 7) >> 3)) &
                             0xfffffffc);

  bit_reverse_region((unsigned short *)longptr, w, h, DLWORD_PERLINE);

  return;

}